

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  
  bVar1 = *p;
  if ((long)(char)bVar1 < 0) {
    uVar3 = ((uint)(byte)p[1] * 0x80 + (uint)bVar1) - 0x80;
    if (p[1] < '\0') {
      auVar4 = google::protobuf::internal::VarintParseSlow64(p,uVar3);
      pcVar2 = auVar4._0_8_;
      *out = auVar4._8_8_;
    }
    else {
      *out = (ulong)uVar3;
      pcVar2 = p + 2;
    }
  }
  else {
    *out = (long)(char)bVar1;
    pcVar2 = p + 1;
  }
  return pcVar2;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* VarintParse(const char* p, T* out) {
  auto ptr = reinterpret_cast<const uint8*>(p);
  uint32 res = ptr[0];
  if (!(res & 0x80)) {
    *out = res;
    return p + 1;
  }
  uint32 byte = ptr[1];
  res += (byte - 1) << 7;
  if (!(byte & 0x80)) {
    *out = res;
    return p + 2;
  }
  return VarintParseSlow(p, res, out);
}